

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

void __thiscall PSBTOutput::FromSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  uint256 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  uchar *puVar7;
  uint uVar8;
  _Rb_tree_header *p_Var9;
  long in_FS_OFFSET;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_68;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->redeem_script).super_CScriptBase._size;
  uVar8 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar8 = uVar2;
  }
  if (uVar8 == 0) {
    uVar2 = (sigdata->redeem_script).super_CScriptBase._size;
    uVar8 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar8 = uVar2;
    }
    if (uVar8 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,
                 &(sigdata->redeem_script).super_CScriptBase);
    }
  }
  uVar2 = (this->witness_script).super_CScriptBase._size;
  uVar8 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar8 = uVar2;
  }
  if (uVar8 == 0) {
    uVar2 = (sigdata->witness_script).super_CScriptBase._size;
    uVar8 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar8 = uVar2;
    }
    if (uVar8 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->witness_script).super_CScriptBase,
                 &(sigdata->witness_script).super_CScriptBase);
    }
  }
  p_Var6 = (sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var9) {
    do {
      std::
      _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
      ::_M_emplace_unique<std::pair<CPubKey,KeyOriginInfo>const&>
                ((_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
                  *)&this->hd_keypaths,(pair<CPubKey,_KeyOriginInfo> *)&p_Var6[1]._M_right);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var9);
  }
  puVar1 = &(sigdata->tr_spenddata).merkle_root;
  puVar7 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (&sigdata->tr_spenddata,puVar1);
  if ((uint256 *)puVar7 != puVar1) {
    uVar3 = *(undefined8 *)
             (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems;
    uVar4 = *(undefined8 *)
             ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
             8);
    uVar5 = *(undefined8 *)
             ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
             0x18);
    *(undefined8 *)
     ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)
          ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
          0x10);
    *(undefined8 *)
     ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
    *(undefined8 *)(this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
         uVar3;
    *(undefined8 *)((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8)
         = uVar4;
  }
  if (((sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
       super__Optional_payload<TaprootBuilder,_true,_false,_false>.
       super__Optional_payload_base<TaprootBuilder>._M_engaged == true) &&
     (*(pointer *)
       &(sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
        super__Optional_payload<TaprootBuilder,_true,_false,_false>.
        super__Optional_payload_base<TaprootBuilder>._M_payload._M_value.m_branch.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      != *(pointer *)
          ((long)&(sigdata->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>.
                  _M_payload.super__Optional_payload<TaprootBuilder,_true,_false,_false>.
                  super__Optional_payload_base<TaprootBuilder>._M_payload._M_value.m_branch + 8))) {
    TaprootBuilder::GetTreeTuples(&local_68,(TaprootBuilder *)&sigdata->tr_builder);
    local_48.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->m_tap_tree).
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->m_tap_tree).
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->m_tap_tree).
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_tap_tree).
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_tap_tree).
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_tap_tree).
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&local_68);
  }
  p_Var6 = (sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var9) {
    do {
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&this->m_tap_bip32_paths,(XOnlyPubKey *)(p_Var6 + 1),
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)(p_Var6 + 2));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTOutput::FromSignatureData(const SignatureData& sigdata)
{
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    for (const auto& entry : sigdata.misc_pubkeys) {
        hd_keypaths.emplace(entry.second);
    }
    if (!sigdata.tr_spenddata.internal_key.IsNull()) {
        m_tap_internal_key = sigdata.tr_spenddata.internal_key;
    }
    if (sigdata.tr_builder.has_value() && sigdata.tr_builder->HasScripts()) {
        m_tap_tree = sigdata.tr_builder->GetTreeTuples();
    }
    for (const auto& [pubkey, leaf_origin] : sigdata.taproot_misc_pubkeys) {
        m_tap_bip32_paths.emplace(pubkey, leaf_origin);
    }
}